

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void fmt::internal::report_unknown_type(char code,char *type)

{
  int iVar1;
  FormatError *this;
  char **in_R8;
  char code_local;
  char *type_local;
  int local_3c;
  string local_38;
  
  code_local = code;
  type_local = type;
  iVar1 = isprint((uint)(byte)code);
  this = (FormatError *)__cxa_allocate_exception(0x10);
  if (iVar1 == 0) {
    local_3c = (int)code;
    format<unsigned_int,char_const*>
              (&local_38,(fmt *)"unknown format code \'\\x{:02x}\' for {}",(CStringRef)&local_3c,
               (uint *)&type_local,in_R8);
    FormatError::FormatError(this,(CStringRef)local_38._M_dataplus._M_p);
    __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
  }
  format<char,char_const*>
            (&local_38,(fmt *)"unknown format code \'{}\' for {}",(CStringRef)&code_local,
             (char *)&type_local,in_R8);
  FormatError::FormatError(this,(CStringRef)local_38._M_dataplus._M_p);
  __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

FMT_FUNC void fmt::internal::report_unknown_type(char code, const char *type) {
  (void)type;
  if (std::isprint(static_cast<unsigned char>(code))) {
    FMT_THROW(fmt::FormatError(
        fmt::format("unknown format code '{}' for {}", code, type)));
  }
  FMT_THROW(fmt::FormatError(
      fmt::format("unknown format code '\\x{:02x}' for {}",
        static_cast<unsigned>(code), type)));
}